

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O1

uint32_t xray_re::xr_file_system::file_age(char *path)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  _Alloc_hider _Var4;
  stat st;
  path local_c8;
  stat local_a0;
  
  local_a0.st_dev = (__dev_t)path;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_c8,(char **)&local_a0,auto_format);
  _Var4._M_p = local_c8._M_pathname._M_dataplus._M_p;
  do {
    if (*_Var4._M_p == '\\') {
      *_Var4._M_p = '/';
    }
    cVar1 = *_Var4._M_p;
    _Var4._M_p = _Var4._M_p + 1;
  } while (cVar1 != '\0');
  iVar2 = stat(local_c8._M_pathname._M_dataplus._M_p,&local_a0);
  std::filesystem::__cxx11::path::~path(&local_c8);
  uVar3 = 0;
  if (iVar2 == 0) {
    uVar3 = (uint32_t)local_a0.st_mtim.tv_sec;
  }
  return uVar3;
}

Assistant:

uint32_t xr_file_system::file_age(const char* path)
{
struct stat st;

	if(stat(CPath(path).make_preferred().c_str(), &st) == 0)
		return uint32_t(st.st_mtime);

	return 0;
}